

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::buildDescriptorSets
          (ComputeCacheTestInstance *this,deUint32 ndx)

{
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  DeviceInterface *vk_00;
  Handle<(vk::HandleType)8> *pHVar1;
  DescriptorPoolBuilder *this_00;
  Handle<(vk::HandleType)21> *pHVar2;
  Handle<(vk::HandleType)22> *pHVar3;
  reference pBufferInfo;
  Location local_240;
  VkDescriptorSet local_238;
  uint local_22c;
  undefined1 local_228 [4];
  deUint32 descriptorNdx;
  DescriptorSetUpdateBuilder builder;
  RefData<vk::Handle<(vk::HandleType)22>_> local_1c0;
  undefined1 local_1a0 [8];
  VkDescriptorSetAllocateInfo descriptorSetAllocInfo;
  Move<vk::Handle<(vk::HandleType)21>_> local_160;
  RefData<vk::Handle<(vk::HandleType)21>_> local_140;
  deUint64 local_120;
  VkDescriptorBufferInfo local_118;
  deUint64 local_100;
  VkDescriptorBufferInfo local_f8;
  undefined1 local_e0 [8];
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptorInfos;
  RefData<vk::Handle<(vk::HandleType)19>_> local_a8;
  uint local_74;
  undefined1 local_70 [4];
  deUint32 bindingNdx;
  DescriptorSetLayoutBuilder descLayoutBuilder;
  VkDevice vkDevice;
  DeviceInterface *vk;
  deUint32 ndx_local;
  ComputeCacheTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  descLayoutBuilder.m_immutableSamplers.
  super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_70);
  for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
    ::vk::DescriptorSetLayoutBuilder::addSingleBinding
              ((DescriptorSetLayoutBuilder *)local_70,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  }
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &descriptorInfos.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (DescriptorSetLayoutBuilder *)local_70,vk_00,
             (VkDevice)
             descLayoutBuilder.m_immutableSamplers.
             super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_a8,
             (Move *)&descriptorInfos.
                      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data.deleter.m_deviceIface = local_a8.deleter.m_deviceIface;
  data.object.m_internal = local_a8.object.m_internal;
  data.deleter.m_device = local_a8.deleter.m_device;
  data.deleter.m_allocator = local_a8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (this->m_descriptorSetLayout + ndx,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &descriptorInfos.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_e0);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_inputBuf).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_100 = pHVar1->m_internal;
  ::vk::makeDescriptorBufferInfo(&local_f8,(VkBuffer)local_100,0,0x800);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::push_back
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_e0,&local_f8);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&this->m_outputBuf[ndx].super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_120 = pHVar1->m_internal;
  ::vk::makeDescriptorBufferInfo(&local_118,(VkBuffer)local_120,0,0x800);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::push_back
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_e0,&local_118);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&descriptorSetAllocInfo.pSetLayouts);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&descriptorSetAllocInfo.pSetLayouts,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  ::vk::DescriptorPoolBuilder::build
            (&local_160,this_00,vk_00,
             (VkDevice)
             descLayoutBuilder.m_immutableSamplers.
             super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_140,(Move *)&local_160);
  data_00.deleter.m_deviceIface = local_140.deleter.m_deviceIface;
  data_00.object.m_internal = local_140.object.m_internal;
  data_00.deleter.m_device = local_140.deleter.m_device;
  data_00.deleter.m_allocator = local_140.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (this->m_descriptorPool + ndx,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_160);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&descriptorSetAllocInfo.pSetLayouts);
  local_1a0._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  descriptorSetAllocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorSetAllocInfo._4_4_ = 0;
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&this->m_descriptorPool[ndx].super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  descriptorSetAllocInfo.pNext = (void *)pHVar2->m_internal;
  descriptorSetAllocInfo.descriptorPool.m_internal._0_4_ = 1;
  descriptorSetAllocInfo._24_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 (&this->m_descriptorSetLayout[ndx].super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &builder.m_copies.
              super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,vk_00,
             (VkDevice)
             descLayoutBuilder.m_immutableSamplers.
             super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (VkDescriptorSetAllocateInfo *)local_1a0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1c0,
             (Move *)&builder.m_copies.
                      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_01.deleter.m_deviceIface = local_1c0.deleter.m_deviceIface;
  data_01.object.m_internal = local_1c0.object.m_internal;
  data_01.deleter.m_device = local_1c0.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_1c0.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
            (this->m_descriptorSet + ndx,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &builder.m_copies.
              super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_228);
  for (local_22c = 0; local_22c < 2; local_22c = local_22c + 1) {
    pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&this->m_descriptorSet[ndx].super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    local_238.m_internal = pHVar3->m_internal;
    local_240 = ::vk::DescriptorSetUpdateBuilder::Location::binding(local_22c);
    pBufferInfo = std::
                  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
                  operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                              *)local_e0,(ulong)local_22c);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              ((DescriptorSetUpdateBuilder *)local_228,local_238,&local_240,
               VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,pBufferInfo);
  }
  ::vk::DescriptorSetUpdateBuilder::update
            ((DescriptorSetUpdateBuilder *)local_228,vk_00,
             (VkDevice)
             descLayoutBuilder.m_immutableSamplers.
             super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_228);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::~vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_e0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_70);
  return;
}

Assistant:

void ComputeCacheTestInstance::buildDescriptorSets (deUint32 ndx)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create descriptor set layout
	DescriptorSetLayoutBuilder descLayoutBuilder;

	for (deUint32 bindingNdx = 0u; bindingNdx < 2u; bindingNdx++)
		descLayoutBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT);

	m_descriptorSetLayout[ndx] = descLayoutBuilder.build(vk, vkDevice);

	std::vector<VkDescriptorBufferInfo>        descriptorInfos;
	descriptorInfos.push_back(makeDescriptorBufferInfo(*m_inputBuf, 0u, sizeof(tcu::Vec4) * 128u));
	descriptorInfos.push_back(makeDescriptorBufferInfo(*m_outputBuf[ndx], 0u, sizeof(tcu::Vec4) * 128u));

	// Create descriptor pool
	m_descriptorPool[ndx] = DescriptorPoolBuilder().addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2u).build(vk,
																										 vkDevice,
																										 VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
																										 1u);

	// Create descriptor set
	const VkDescriptorSetAllocateInfo descriptorSetAllocInfo =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,     // VkStructureType                 sType;
		DE_NULL,                                            // const void*                     pNext;
		*m_descriptorPool[ndx],                             // VkDescriptorPool                descriptorPool;
		1u,                                                 // deUint32                        setLayoutCount;
		&m_descriptorSetLayout[ndx].get(),                  // const VkDescriptorSetLayout*    pSetLayouts;
	};
	m_descriptorSet[ndx] = allocateDescriptorSet(vk, vkDevice, &descriptorSetAllocInfo);

	DescriptorSetUpdateBuilder  builder;
	for (deUint32 descriptorNdx = 0u; descriptorNdx < 2u; descriptorNdx++)
	{
		builder.writeSingle(*m_descriptorSet[ndx],
							DescriptorSetUpdateBuilder::Location::binding(descriptorNdx),
							VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
							&descriptorInfos[descriptorNdx]);
	}
	builder.update(vk, vkDevice);
}